

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprocess.cpp
# Opt level: O0

void QProcess::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QProcessPrivate *this;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QProcess *in_RDI;
  bool _r_3;
  bool _r_2;
  bool _r_1;
  bool _r;
  QProcess *_t;
  ExitStatus in_stack_ffffffffffffff68;
  ProcessError in_stack_ffffffffffffff6c;
  QProcessPrivate *in_stack_ffffffffffffff78;
  QProcessPrivate *in_stack_ffffffffffffffa0;
  
  if (in_ESI == 0) {
    this = (QProcessPrivate *)(ulong)in_EDX;
    switch(this) {
    case (QProcessPrivate *)0x0:
      started(in_RDI);
      break;
    case (QProcessPrivate *)0x1:
      finished((QProcess *)0x7930e5,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      break;
    case (QProcessPrivate *)0x2:
      finished((QProcess *)0x793104,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      break;
    case (QProcessPrivate *)0x3:
      errorOccurred((QProcess *)0x793121,in_stack_ffffffffffffff6c);
      break;
    case (QProcessPrivate *)0x4:
      stateChanged(in_RDI,**(undefined4 **)(in_RCX + 8));
      break;
    case (QProcessPrivate *)0x5:
      readyReadStandardOutput(in_RDI);
      break;
    case (QProcessPrivate *)0x6:
      readyReadStandardError(in_RDI);
      break;
    case (QProcessPrivate *)0x7:
      terminate((QProcess *)this);
      break;
    case (QProcessPrivate *)0x8:
      kill(in_RDI,0,in_EDX);
      break;
    case (QProcessPrivate *)0x9:
      d_func((QProcess *)0x793189);
      bVar1 = QProcessPrivate::_q_canReadStandardOutput((QProcessPrivate *)0x793191);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QProcessPrivate *)0xa:
      d_func((QProcess *)0x7931c8);
      bVar1 = QProcessPrivate::_q_canReadStandardError((QProcessPrivate *)0x7931d0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QProcessPrivate *)0xb:
      d_func((QProcess *)0x793207);
      bVar1 = QProcessPrivate::_q_canWrite(in_stack_ffffffffffffff78);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QProcessPrivate *)0xc:
      d_func((QProcess *)0x793243);
      bVar1 = QProcessPrivate::_q_startupNotification(in_stack_ffffffffffffffa0);
      if (*(long *)in_RCX != 0) {
        *(bool *)*(undefined8 *)in_RCX = bVar1;
      }
      break;
    case (QProcessPrivate *)0xd:
      d_func((QProcess *)0x79327f);
      QProcessPrivate::_q_processDied(this);
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::QPrivateSignal)>
                          (in_RCX,(void **)started,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(int,QProcess::ExitStatus)>
                         (in_RCX,(void **)finished,0,1), !bVar1)) &&
     (((bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::ProcessError)>
                          (in_RCX,(void **)errorOccurred,0,3), !bVar1 &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QProcess::*)(QProcess::ProcessState,QProcess::QPrivateSignal)>
                          (in_RCX,(void **)stateChanged,0,4), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::QPrivateSignal)>
                         (in_RCX,(void **)readyReadStandardOutput,0,5), !bVar1)))) {
    QtMocHelpers::indexOfMethod<void(QProcess::*)(QProcess::QPrivateSignal)>
              (in_RCX,(void **)readyReadStandardError,0,6);
  }
  return;
}

Assistant:

void QProcess::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QProcess *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->started(QPrivateSignal()); break;
        case 1: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QProcess::ExitStatus>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->errorOccurred((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessError>>(_a[1]))); break;
        case 4: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QProcess::ProcessState>>(_a[1])), QPrivateSignal()); break;
        case 5: _t->readyReadStandardOutput(QPrivateSignal()); break;
        case 6: _t->readyReadStandardError(QPrivateSignal()); break;
        case 7: _t->terminate(); break;
        case 8: _t->kill(); break;
        case 9: { bool _r = _t->d_func()->_q_canReadStandardOutput();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 10: { bool _r = _t->d_func()->_q_canReadStandardError();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 11: { bool _r = _t->d_func()->_q_canWrite();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 12: { bool _r = _t->d_func()->_q_startupNotification();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: _t->d_func()->_q_processDied(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::started, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(int , QProcess::ExitStatus )>(_a, &QProcess::finished, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessError )>(_a, &QProcess::errorOccurred, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QProcess::ProcessState , QPrivateSignal)>(_a, &QProcess::stateChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardOutput, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QProcess::*)(QPrivateSignal)>(_a, &QProcess::readyReadStandardError, 6))
            return;
    }
}